

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

bool __thiscall
Lowerer::GenerateFastCharAt
          (Lowerer *this,BuiltinFunction index,Opnd *dst,Opnd *srcStr,Opnd *srcIndex,
          Instr *callInstr,Instr *insertInstr,LabelInstr *labelHelper,LabelInstr *doneLabel)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  int32 iVar4;
  uint32 uVar5;
  int iVar6;
  RegOpnd *pRVar7;
  PragmaInstr *instr;
  RegOpnd *baseOpnd;
  RegOpnd *baseOpnd_00;
  IndirOpnd *pIVar8;
  AddrOpnd *pAVar9;
  Opnd *pOVar10;
  IntConstOpnd *pIVar11;
  undefined4 *puVar12;
  RegOpnd *local_98;
  Opnd *resultOpnd;
  RegOpnd *charReg;
  RegOpnd *maskOpnd;
  RegOpnd *r2;
  uint32 maskedIndex;
  uint32 indexValue;
  Opnd *indexOpnd;
  RegOpnd *strLength;
  IndirOpnd *indirOpnd;
  RegOpnd *r1;
  Instr *fakeBr;
  RegOpnd *regSrcStr;
  bool isNotTaggedValue;
  bool isInt;
  Instr *callInstr_local;
  Opnd *srcIndex_local;
  Opnd *srcStr_local;
  Opnd *dst_local;
  Lowerer *this_local;
  BuiltinFunction index_local;
  
  bVar3 = false;
  regSrcStr._6_1_ = false;
  this_local._6_1_ = index._value;
  bVar2 = IR::Opnd::IsRegOpnd(srcStr);
  if (bVar2) {
    pRVar7 = IR::Opnd::AsRegOpnd(srcStr);
    bVar2 = IR::Opnd::IsTaggedInt(&pRVar7->super_Opnd);
    if (bVar2) {
      bVar3 = true;
    }
    else {
      pRVar7 = IR::Opnd::AsRegOpnd(srcStr);
      regSrcStr._6_1_ = IR::Opnd::IsNotTaggedValue(&pRVar7->super_Opnd);
    }
  }
  pRVar7 = GetRegOpnd(this,srcStr,insertInstr,this->m_func,TyVar);
  if (regSrcStr._6_1_ == false) {
    if (bVar3) {
      instr = IR::PragmaInstr::New(DeletedNonHelperBranch,0,this->m_func);
      IR::Instr::InsertBefore(insertInstr,&instr->super_Instr);
      InsertBranch(Br,labelHelper,insertInstr);
    }
    else {
      LowererMD::GenerateObjectTest
                (&this->m_lowererMD,&pRVar7->super_Opnd,insertInstr,labelHelper,false);
    }
  }
  bVar3 = IR::Opnd::IsAddrOpnd(srcIndex);
  if (bVar3) {
    pAVar9 = IR::Opnd::AsAddrOpnd(srcIndex);
    iVar4 = Js::TaggedInt::ToInt32(pAVar9->m_address);
    if (iVar4 < 0) {
      labelHelper->field_0x78 = labelHelper->field_0x78 & 0xfd;
      InsertBranch(Br,labelHelper,insertInstr);
      return false;
    }
  }
  GenerateStringTest(this,pRVar7,insertInstr,labelHelper,(LabelInstr *)0x0,false);
  baseOpnd = IR::RegOpnd::New(TyInt64,this->m_func);
  baseOpnd_00 = IR::Opnd::AsRegOpnd(&pRVar7->super_Opnd);
  uVar5 = Js::JavascriptString::GetOffsetOfpszValue();
  pIVar8 = IR::IndirOpnd::New(baseOpnd_00,uVar5,TyUint64,this->m_func,false);
  InsertMove(&baseOpnd->super_Opnd,&pIVar8->super_Opnd,insertInstr,true);
  InsertTestBranch(&baseOpnd->super_Opnd,&baseOpnd->super_Opnd,BrEq_A,labelHelper,insertInstr);
  indexOpnd = &IR::RegOpnd::New(TyUint32,this->m_func)->super_Opnd;
  pIVar8 = IR::IndirOpnd::New(pRVar7,0x18,TyUint32,this->m_func,false);
  InsertMove(indexOpnd,&pIVar8->super_Opnd,insertInstr,true);
  bVar3 = IR::Opnd::IsAddrOpnd(srcIndex);
  if (bVar3) {
    pAVar9 = IR::Opnd::AsAddrOpnd(srcIndex);
    uVar5 = Js::TaggedInt::ToUInt32(pAVar9->m_address);
    pIVar11 = IR::IntConstOpnd::New((ulong)uVar5,TyUint32,this->m_func,false);
    InsertCompareBranch(this,indexOpnd,&pIVar11->super_Opnd,BrLe_A,true,labelHelper,insertInstr,
                        false);
    strLength = (RegOpnd *)IR::IndirOpnd::New(baseOpnd,uVar5 << 1,TyUint16,this->m_func,false);
    _maskedIndex = IR::IntConstOpnd::New((ulong)uVar5,TyUint64,this->m_func,false);
  }
  else {
    pRVar7 = IR::RegOpnd::New(TyVar,this->m_func);
    InsertMove(&pRVar7->super_Opnd,srcIndex,insertInstr,true);
    maskOpnd = GenerateUntagVar(this,pRVar7,labelHelper,insertInstr,true);
    InsertCompareBranch(this,indexOpnd,&maskOpnd->super_Opnd,BrLe_A,true,labelHelper,insertInstr,
                        false);
    iVar6 = IR::Opnd::GetSize(&maskOpnd->super_Opnd);
    if (iVar6 != 8) {
      pOVar10 = IR::Opnd::UseWithNewType(&maskOpnd->super_Opnd,TyUint64,this->m_func);
      maskOpnd = IR::Opnd::AsRegOpnd(pOVar10);
    }
    _maskedIndex = (IntConstOpnd *)maskOpnd;
    strLength = (RegOpnd *)IR::IndirOpnd::New(baseOpnd,maskOpnd,'\x01',TyUint16,this->m_func);
  }
  charReg = (RegOpnd *)0x0;
  if ((DAT_01eafd1f & 1) != 0) {
    charReg = IR::RegOpnd::New(TyUint64,this->m_func);
    iVar6 = IR::Opnd::GetSize(indexOpnd);
    if (iVar6 != 8) {
      pOVar10 = IR::Opnd::UseWithNewType(indexOpnd,TyUint64,this->m_func);
      indexOpnd = &IR::Opnd::AsRegOpnd(pOVar10)->super_Opnd;
    }
    InsertSub(false,&charReg->super_Opnd,&_maskedIndex->super_Opnd,indexOpnd,insertInstr);
    pIVar11 = IR::IntConstOpnd::New(0x3f,TyInt8,this->m_func,false);
    InsertShift(Shr_A,false,&charReg->super_Opnd,&charReg->super_Opnd,&pIVar11->super_Opnd,
                insertInstr);
    iVar6 = IR::Opnd::GetSize(&charReg->super_Opnd);
    if (iVar6 != 7) {
      pOVar10 = IR::Opnd::UseWithNewType(&charReg->super_Opnd,TyUint32,this->m_func);
      charReg = IR::Opnd::AsRegOpnd(pOVar10);
    }
  }
  resultOpnd = &IR::RegOpnd::New(TyUint32,this->m_func)->super_Opnd;
  InsertMove(resultOpnd,&strLength->super_Opnd,insertInstr,true);
  if ((DAT_01eafd1f & 1) != 0) {
    InsertAnd(resultOpnd,resultOpnd,&charReg->super_Opnd,insertInstr);
  }
  bVar3 = Js::BuiltinFunction::operator==
                    ((BuiltinFunction *)((long)&this_local + 6),JavascriptString_CharAt);
  if (bVar3) {
    bVar3 = IR::Opnd::IsEqual(dst,srcStr);
    local_98 = (RegOpnd *)dst;
    if (bVar3) {
      local_98 = IR::RegOpnd::New(TyVar,this->m_func);
    }
    GenerateGetSingleCharString
              (this,(RegOpnd *)resultOpnd,&local_98->super_Opnd,labelHelper,doneLabel,insertInstr,
               false);
  }
  else {
    bVar3 = Js::BuiltinFunction::operator==
                      ((BuiltinFunction *)((long)&this_local + 6),JavascriptString_CharCodeAt);
    if ((!bVar3) &&
       (bVar3 = Js::BuiltinFunction::operator==
                          ((BuiltinFunction *)((long)&this_local + 6),JavascriptString_CodePointAt),
       !bVar3)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar12 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x5476,
                         "(index == Js::BuiltinFunction::JavascriptString_CharCodeAt || index == Js::BuiltinFunction::JavascriptString_CodePointAt)"
                         ,
                         "index == Js::BuiltinFunction::JavascriptString_CharCodeAt || index == Js::BuiltinFunction::JavascriptString_CodePointAt"
                        );
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar12 = 0;
    }
    bVar3 = Js::BuiltinFunction::operator==
                      ((BuiltinFunction *)((long)&this_local + 6),JavascriptString_CodePointAt);
    if (bVar3) {
      GenerateFastInlineStringCodePointAt
                (this,insertInstr,this->m_func,indexOpnd,srcIndex,(RegOpnd *)resultOpnd,baseOpnd);
    }
    iVar6 = IR::Opnd::GetSize(resultOpnd);
    if (iVar6 != 8) {
      pOVar10 = IR::Opnd::UseWithNewType(resultOpnd,TyUint64,this->m_func);
      resultOpnd = &IR::Opnd::AsRegOpnd(pOVar10)->super_Opnd;
    }
    LowererMD::GenerateInt32ToVarConversion(&this->m_lowererMD,resultOpnd,insertInstr);
    InsertMove(dst,resultOpnd,insertInstr,true);
  }
  return true;
}

Assistant:

bool
Lowerer::GenerateFastCharAt(Js::BuiltinFunction index, IR::Opnd *dst, IR::Opnd *srcStr, IR::Opnd *srcIndex, IR::Instr *callInstr,
    IR::Instr *insertInstr, IR::LabelInstr *labelHelper, IR::LabelInstr *doneLabel)
{
    //  if regSrcStr is not object, JMP $helper
    //  CMP [regSrcStr + offset(type)] , static string type   -- check base string type
    //  JNE $helper
    //  MOV r1, [regSrcStr + offset(m_pszValue)]
    //  TEST r1, r1
    //  JEQ $helper
    //  MOV r2, srcIndex
    //  If r2 is not int, JMP $helper
    //  Convert r2 to int
    //  CMP [regSrcStr + offsetof(length)], r2
    //  JBE $helper
    //  MOVZX r2, [r1 + r2 * 2]
    //  if (charAt)
    //      PUSH r1
    //      PUSH scriptContext
    //      CALL GetStringFromChar
    //      MOV dst, EAX
    //  else (charCodeAt)
    //      if (codePointAt)
    //          Lowerer.GenerateFastCodePointAt -- Common inline functions
    //      Convert r2 to Var
    //      MOV dst, r2
    bool isInt = false;
    bool isNotTaggedValue = false;

    if (srcStr->IsRegOpnd())
    {
        if (srcStr->AsRegOpnd()->IsTaggedInt())
        {
            isInt = true;

        }
        else if (srcStr->AsRegOpnd()->IsNotTaggedValue())
        {
            isNotTaggedValue = true;
        }
    }

    IR::RegOpnd *regSrcStr = GetRegOpnd(srcStr, insertInstr, m_func, TyVar);

    if (!isNotTaggedValue)
    {
        if (!isInt)
        {
            m_lowererMD.GenerateObjectTest(regSrcStr, insertInstr, labelHelper);
        }
        else
        {
            // Insert delete branch opcode to tell the dbChecks not to assert on this helper label
            IR::Instr *fakeBr = IR::PragmaInstr::New(Js::OpCode::DeletedNonHelperBranch, 0, this->m_func);
            insertInstr->InsertBefore(fakeBr);

            InsertBranch(Js::OpCode::Br, labelHelper, insertInstr);
        }
    }

    // Bail out if index a constant and is less than zero.
    if (srcIndex->IsAddrOpnd() && Js::TaggedInt::ToInt32(srcIndex->AsAddrOpnd()->m_address) < 0)
    {
        labelHelper->isOpHelper = false;
        InsertBranch(Js::OpCode::Br, labelHelper, insertInstr);
        return false;
    }

    GenerateStringTest(regSrcStr, insertInstr, labelHelper, nullptr, false);

    // r1 contains the value of the char16* pointer inside JavascriptString.
    // MOV r1, [regSrcStr + offset(m_pszValue)]
    IR::RegOpnd *r1 = IR::RegOpnd::New(TyMachReg, this->m_func);
    IR::IndirOpnd * indirOpnd = IR::IndirOpnd::New(regSrcStr->AsRegOpnd(), Js::JavascriptString::GetOffsetOfpszValue(), TyMachPtr, this->m_func);
    InsertMove(r1, indirOpnd, insertInstr);

    // TEST r1, r1 -- Null pointer test
    // JEQ $helper
    InsertTestBranch(r1, r1, Js::OpCode::BrEq_A, labelHelper, insertInstr);

    IR::RegOpnd *strLength = IR::RegOpnd::New(TyUint32, m_func);
    InsertMove(strLength, IR::IndirOpnd::New(regSrcStr, offsetof(Js::JavascriptString, m_charLength), TyUint32, this->m_func), insertInstr);
    IR::Opnd* indexOpnd = nullptr;
    if (srcIndex->IsAddrOpnd())
    {
        uint32 indexValue = Js::TaggedInt::ToUInt32(srcIndex->AsAddrOpnd()->m_address);
        // CMP [regSrcStr + offsetof(length)], index
        // Use unsigned compare, this should handle negative indexes as well (they become > INT_MAX)
        // JBE $helper
        InsertCompareBranch(strLength, IR::IntConstOpnd::New(indexValue, TyUint32, m_func), Js::OpCode::BrLe_A, true, labelHelper, insertInstr);

        // Mask off the sign so that poisoning will work for negative indices
#if TARGET_32
        uint32 maskedIndex = CONFIG_FLAG_RELEASE(PoisonStringLoad) ? (indexValue & INT32_MAX) : indexValue;
#else
        uint32 maskedIndex = indexValue;
#endif
        indirOpnd = IR::IndirOpnd::New(r1, maskedIndex * sizeof(char16), TyUint16, this->m_func);
        indexOpnd = IR::IntConstOpnd::New(maskedIndex, TyMachPtr, m_func);
    }
    else
    {
        IR::RegOpnd *r2 = IR::RegOpnd::New(TyVar, this->m_func);
        // MOV r2, srcIndex
        InsertMove(r2, srcIndex, insertInstr);

        r2 = GenerateUntagVar(r2, labelHelper, insertInstr);

        // CMP [regSrcStr + offsetof(length)], r2
        // Use unsigned compare, this should handle negative indexes as well (they become > INT_MAX)
        // JBE $helper
        InsertCompareBranch(strLength, r2, Js::OpCode::BrLe_A, true, labelHelper, insertInstr);

#if TARGET_32
        if (CONFIG_FLAG_RELEASE(PoisonStringLoad))
        {
            // Mask off the sign so that poisoning will work for negative indices
            InsertAnd(r2, r2, IR::IntConstOpnd::New(INT32_MAX, TyInt32, m_func), insertInstr);
        }
#endif

        if (r2->GetSize() != MachPtr)
        {
            r2 = r2->UseWithNewType(TyMachPtr, this->m_func)->AsRegOpnd();
        }
        indexOpnd = r2;

        indirOpnd = IR::IndirOpnd::New(r1, r2, 1, TyUint16, this->m_func);
    }
    IR::RegOpnd* maskOpnd = nullptr;
    if (CONFIG_FLAG_RELEASE(PoisonStringLoad))
    {
        maskOpnd = IR::RegOpnd::New(TyMachPtr, m_func);
        if (strLength->GetSize() != MachPtr)
        {
            strLength = strLength->UseWithNewType(TyMachPtr, this->m_func)->AsRegOpnd();
        }
        InsertSub(false, maskOpnd, indexOpnd, strLength, insertInstr);
        InsertShift(Js::OpCode::Shr_A, false, maskOpnd, maskOpnd, IR::IntConstOpnd::New(MachRegInt * 8 - 1, TyInt8, m_func), insertInstr);

        if (maskOpnd->GetSize() != TyUint32)
        {
            maskOpnd = maskOpnd->UseWithNewType(TyUint32, this->m_func)->AsRegOpnd();
        }
    }
    // MOVZX charReg, [r1 + r2 * 2]  -- this is the value of the char
    IR::RegOpnd *charReg = IR::RegOpnd::New(TyUint32, this->m_func);
    InsertMove(charReg, indirOpnd, insertInstr);
    if (CONFIG_FLAG_RELEASE(PoisonStringLoad))
    {
        InsertAnd(charReg, charReg, maskOpnd, insertInstr);
    }
    if (index == Js::BuiltinFunction::JavascriptString_CharAt)
    {
        IR::Opnd *resultOpnd;
        if (dst->IsEqual(srcStr))
        {
            resultOpnd = IR::RegOpnd::New(TyVar, this->m_func);
        }
        else
        {
            resultOpnd = dst;
        }
        GenerateGetSingleCharString(charReg, resultOpnd, labelHelper, doneLabel, insertInstr, false);
    }
    else
    {
        Assert(index == Js::BuiltinFunction::JavascriptString_CharCodeAt || index == Js::BuiltinFunction::JavascriptString_CodePointAt);

        if (index == Js::BuiltinFunction::JavascriptString_CodePointAt)
        {
            GenerateFastInlineStringCodePointAt(insertInstr, this->m_func, strLength, srcIndex, charReg, r1);
        }

        if (charReg->GetSize() != MachPtr)
        {
            charReg = charReg->UseWithNewType(TyMachPtr, this->m_func)->AsRegOpnd();
        }
        m_lowererMD.GenerateInt32ToVarConversion(charReg, insertInstr);

        // MOV dst, charReg
        InsertMove(dst, charReg, insertInstr);
    }
    return true;
}